

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

void __thiscall RoboClaw::begin(RoboClaw *this,long speed)

{
  int iVar1;
  char *__file;
  ulong __nbytes;
  void *__buf;
  speed_t in_ESI;
  RoboClaw *in_RDI;
  termios tty;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint local_40;
  
  if (in_RDI->m_serial == -1) {
    __file = (char *)std::__cxx11::string::c_str();
    iVar1 = open(__file,0x101102);
    in_RDI->m_serial = iVar1;
    if (in_RDI->m_serial == -1) {
      perror("Unable to open serial device.");
    }
    else {
      memset(&stack0xffffffffffffffb4,0,0x3c);
      iVar1 = tcgetattr(in_RDI->m_serial,(termios *)&stack0xffffffffffffffb4);
      if (iVar1 == 0) {
        cfsetospeed((termios *)&stack0xffffffffffffffb4,in_ESI);
        cfsetispeed((termios *)&stack0xffffffffffffffb4,in_ESI);
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffea02;
        __nbytes = (ulong)(local_40 & 0xffff7f34);
        iVar1 = tcsetattr(in_RDI->m_serial,0,(termios *)&stack0xffffffffffffffb4);
        if (iVar1 == 0) {
          tcflush(in_RDI->m_serial,2);
          while( true ) {
            iVar1 = available((RoboClaw *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            if (iVar1 < 1) break;
            read(in_RDI,in_RDI->m_timeout,__buf,__nbytes);
          }
          fcntl(in_RDI->m_serial,4,0);
        }
        else {
          perror("tcsetattr failed with error:");
        }
      }
      else {
        perror("error from tcgetattr");
      }
    }
  }
  return;
}

Assistant:

void RoboClaw::begin(long speed)
{
    if( m_serial == -1 )
    {
        m_serial = open ( m_portName.c_str(), O_RDWR | O_NOCTTY | O_SYNC);

        if( m_serial == -1 )
        {
            perror( "Unable to open serial device." );
            return ;
        }

        struct termios tty;
        memset( &tty, 0, sizeof( tty ) );

        if( tcgetattr( m_serial, &tty ) != 0 )
        {
            perror( "error from tcgetattr" );
            return ;
        }

        cfsetospeed( &tty, speed );
        cfsetispeed( &tty, speed );

        // input
        tty.c_iflag &= ~IGNBRK;            // disable ignoring break
        tty.c_iflag &= ~(IGNPAR | PARMRK); // disable parity checks
        tty.c_iflag &= ~INPCK;             // disable parity checking
        tty.c_iflag &= ~ISTRIP;            // disable stripping 8th bit
        tty.c_iflag &= ~(INLCR | ICRNL);   // disable translating NL <-> CR
        tty.c_iflag &= ~IGNCR;             // disable ignoring CR
        tty.c_iflag &= ~(IXON | IXOFF);    // disable XON/XOFF flow control

        // output
        tty.c_oflag &= ~OPOST;            // disable output processing
        tty.c_oflag &= ~(ONLCR | OCRNL);   // disable translating NL <-> CR
        tty.c_oflag &= ~OFILL;            // disable fill characters

        // control flags
        tty.c_cflag |=   CLOCAL;           // prevent changing ownership
        tty.c_cflag |=   CREAD;            // enable reciever
        tty.c_cflag &= ~PARENB;           // disable parity
        tty.c_cflag &= ~CSTOPB;           // disable 2 stop bits
        tty.c_cflag &= ~CSIZE;            // remove size flag...
        tty.c_cflag |=   CS8;              // ...enable 8 bit characters
        tty.c_cflag |=   HUPCL;            // enable lower control lines on close - hang up
        tty.c_cflag &= ~CRTSCTS;          // disable hardware CTS/RTS flow control

        // local flags
        tty.c_lflag &= ~ISIG;             // disable generating signals
        tty.c_lflag &= ~ICANON;           // disable canonical mode - line by line
        tty.c_lflag &= ~ECHO;             // disable echoing characters
        tty.c_lflag &= ~ECHONL;           // ??
        tty.c_lflag &= ~NOFLSH;           // disable flushing on SIGINT
        tty.c_lflag &= ~IEXTEN;           // disable input processing

        if( tcsetattr( m_serial, TCSANOW, &tty ) != 0 )
        {
            perror( "tcsetattr failed with error:" );
            return ;
        }

        tcflush( m_serial, TCIOFLUSH );

        while( available() > 0 )
        {
            read( m_timeout );
        }

        fcntl( m_serial, F_SETFL, 0 );
    }
}